

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionarySGL<false,_false>::search_key(DictionarySGL<false,_false> *this,char *key)

{
  bool bVar1;
  char *in_RSI;
  Query agent;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffffc8;
  Query local_30;
  uint32_t local_4;
  
  Query::Query(&local_30,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                *)0x14e1da);
  bVar1 = DaTrie<false,_false,_false>::search_key
                    (in_stack_ffffffffffffffc8,
                     (Query *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    local_4 = Query::value(&local_30);
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query(&local_30);
  return local_4;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query agent(key);
    if (!trie_->search_key(agent)) {
      return NOT_FOUND;
    }
    return agent.value();
  }